

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

char * google::protobuf::ParsePackedField
                 (FieldDescriptor *field,Message *msg,Reflection *reflection,char *ptr,
                 ParseContext *ctx)

{
  Type TVar1;
  RepeatedField<double> *object;
  RepeatedField<long> *pRVar2;
  char *pcVar3;
  RepeatedField<int> *pRVar4;
  RepeatedField<unsigned_long> *pRVar5;
  RepeatedField<float> *object_00;
  RepeatedField<bool> *object_01;
  void *object_02;
  RepeatedField<unsigned_int> *pRVar6;
  LogMessage *pLVar7;
  InternalMetadataWithArena *metadata;
  LogFinisher local_71;
  EnumDescriptor *local_70;
  LogMessage local_68;
  
  TVar1 = FieldDescriptor::type(field);
  switch(TVar1) {
  case TYPE_DOUBLE:
    object = Reflection::MutableRepeatedField<double>(reflection,msg,field);
    pcVar3 = internal::PackedDoubleParser(object,ptr,ctx);
    return pcVar3;
  case TYPE_FLOAT:
    object_00 = Reflection::MutableRepeatedField<float>(reflection,msg,field);
    pcVar3 = internal::PackedFloatParser(object_00,ptr,ctx);
    return pcVar3;
  case TYPE_INT64:
    pRVar2 = Reflection::MutableRepeatedField<long>(reflection,msg,field);
    pcVar3 = internal::PackedInt64Parser(pRVar2,ptr,ctx);
    return pcVar3;
  case TYPE_UINT64:
    pRVar5 = Reflection::MutableRepeatedField<unsigned_long>(reflection,msg,field);
    pcVar3 = internal::PackedUInt64Parser(pRVar5,ptr,ctx);
    return pcVar3;
  case TYPE_INT32:
    pRVar4 = Reflection::MutableRepeatedField<int>(reflection,msg,field);
    pcVar3 = internal::PackedInt32Parser(pRVar4,ptr,ctx);
    return pcVar3;
  case TYPE_FIXED64:
    pRVar5 = Reflection::MutableRepeatedField<unsigned_long>(reflection,msg,field);
    pcVar3 = internal::PackedFixed64Parser(pRVar5,ptr,ctx);
    return pcVar3;
  case TYPE_FIXED32:
    pRVar6 = Reflection::MutableRepeatedField<unsigned_int>(reflection,msg,field);
    pcVar3 = internal::PackedFixed32Parser(pRVar6,ptr,ctx);
    return pcVar3;
  case TYPE_BOOL:
    object_01 = Reflection::MutableRepeatedField<bool>(reflection,msg,field);
    pcVar3 = internal::PackedBoolParser(object_01,ptr,ctx);
    return pcVar3;
  default:
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
               ,0x115);
    pLVar7 = internal::LogMessage::operator<<(&local_68,"Type is not packable ");
    TVar1 = FieldDescriptor::type(field);
    pLVar7 = internal::LogMessage::operator<<(pLVar7,TVar1);
    internal::LogFinisher::operator=(&local_71,pLVar7);
    internal::LogMessage::~LogMessage(&local_68);
    pcVar3 = (char *)0x0;
    break;
  case TYPE_UINT32:
    pRVar6 = Reflection::MutableRepeatedField<unsigned_int>(reflection,msg,field);
    pcVar3 = internal::PackedUInt32Parser(pRVar6,ptr,ctx);
    return pcVar3;
  case TYPE_ENUM:
    object_02 = internal::ReflectionAccessor::GetRepeatedEnum(reflection,field,msg);
    if (*(int *)(*(long *)(field + 0x28) + 0x3c) == 3) {
      pcVar3 = internal::PackedEnumParser(object_02,ptr,ctx);
      return pcVar3;
    }
    local_70 = FieldDescriptor::enum_type(field);
    metadata = Reflection::MutableInternalMetadataWithArena(reflection,msg);
    pcVar3 = internal::PackedEnumParserArg
                       (object_02,ptr,ctx,ReflectiveValidator,local_70,metadata,
                        *(int *)(field + 0x44));
    break;
  case TYPE_SFIXED32:
    pRVar4 = Reflection::MutableRepeatedField<int>(reflection,msg,field);
    pcVar3 = internal::PackedSFixed32Parser(pRVar4,ptr,ctx);
    return pcVar3;
  case TYPE_SFIXED64:
    pRVar2 = Reflection::MutableRepeatedField<long>(reflection,msg,field);
    pcVar3 = internal::PackedSFixed64Parser(pRVar2,ptr,ctx);
    return pcVar3;
  case TYPE_SINT32:
    pRVar4 = Reflection::MutableRepeatedField<int>(reflection,msg,field);
    pcVar3 = internal::PackedSInt32Parser(pRVar4,ptr,ctx);
    return pcVar3;
  case MAX_TYPE:
    pRVar2 = Reflection::MutableRepeatedField<long>(reflection,msg,field);
    pcVar3 = internal::PackedSInt64Parser(pRVar2,ptr,ctx);
    return pcVar3;
  }
  return pcVar3;
}

Assistant:

const char* ParsePackedField(const FieldDescriptor* field, Message* msg,
                             const Reflection* reflection, const char* ptr,
                             internal::ParseContext* ctx) {
  switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, METHOD_NAME) \
  case FieldDescriptor::TYPE_##TYPE:                   \
    return internal::Packed##METHOD_NAME##Parser(      \
        reflection->MutableRepeatedField<CPPTYPE>(msg, field), ptr, ctx)
    HANDLE_PACKED_TYPE(INT32, int32, Int32);
    HANDLE_PACKED_TYPE(INT64, int64, Int64);
    HANDLE_PACKED_TYPE(SINT32, int32, SInt32);
    HANDLE_PACKED_TYPE(SINT64, int64, SInt64);
    HANDLE_PACKED_TYPE(UINT32, uint32, UInt32);
    HANDLE_PACKED_TYPE(UINT64, uint64, UInt64);
    HANDLE_PACKED_TYPE(BOOL, bool, Bool);
    case FieldDescriptor::TYPE_ENUM: {
      auto object =
          internal::ReflectionAccessor::GetRepeatedEnum(reflection, field, msg);
      if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
        return internal::PackedEnumParser(object, ptr, ctx);
      } else {
        return internal::PackedEnumParserArg(
            object, ptr, ctx, ReflectiveValidator, field->enum_type(),
            internal::ReflectionAccessor::MutableInternalMetadataWithArena(
                reflection, msg),
            field->number());
      }
    }
      HANDLE_PACKED_TYPE(FIXED32, uint32, Fixed32);
      HANDLE_PACKED_TYPE(FIXED64, uint64, Fixed64);
      HANDLE_PACKED_TYPE(SFIXED32, int32, SFixed32);
      HANDLE_PACKED_TYPE(SFIXED64, int64, SFixed64);
      HANDLE_PACKED_TYPE(FLOAT, float, Float);
      HANDLE_PACKED_TYPE(DOUBLE, double, Double);
#undef HANDLE_PACKED_TYPE

    default:
      GOOGLE_LOG(FATAL) << "Type is not packable " << field->type();
      return nullptr;  // Make compiler happy
  }
}